

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O2

void __thiscall
amrex::FabCopyDescriptor<amrex::FArrayBox>::FabCopyDescriptor
          (FabCopyDescriptor<amrex::FArrayBox> *this)

{
  this->localFabSource = (FArrayBox *)0x0;
  (this->subBox).smallend.vect[0] = 1;
  (this->subBox).smallend.vect[1] = 1;
  (this->subBox).smallend.vect[2] = 1;
  (this->subBox).bigend = (int  [3])0x0;
  (this->subBox).btype = 0;
  this->myProc = -1;
  this->copyFromProc = -1;
  this->copyFromIndex = -1;
  this->fillBoxId = -1;
  this->fillBoxId = -1;
  this->srcComp = -1;
  this->destComp = -1;
  this->nComp = -1;
  this->fillType = Unfillable;
  this->cacheDataAllocated = false;
  return;
}

Assistant:

FabCopyDescriptor<FAB>::FabCopyDescriptor ()
    :
    localFabSource(0),
    myProc(-1),
    copyFromProc(-1),
    copyFromIndex(-1),
    fillBoxId(-1),
    srcComp(-1),
    destComp(-1),
    nComp(-1),
    fillType(Unfillable),
    cacheDataAllocated(false)
{}